

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

void __thiscall NanoVM::NanoVM(NanoVM *this,string *fileName)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  uchar *puVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  char local_230 [8];
  ifstream file;
  undefined1 auStack_28 [8];
  streampos size;
  string *fileName_local;
  NanoVM *this_local;
  
  (this->cpu).codeSize = 0;
  (this->cpu).stackSize = 0;
  (this->cpu).codeBase = (uchar *)0x0;
  (this->cpu).stackBase = (uchar *)0x0;
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[9] = 0;
  (this->cpu).registers[6] = 0;
  (this->cpu).registers[7] = 0;
  (this->cpu).registers[4] = 0;
  (this->cpu).registers[5] = 0;
  (this->cpu).registers[2] = 0;
  (this->cpu).registers[3] = 0;
  (this->cpu).registers[0] = 0;
  (this->cpu).registers[1] = 0;
  (this->cpu).bytecodeSize = 0;
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[9] = 0;
  (this->cpu).registers[6] = 0;
  (this->cpu).registers[7] = 0;
  (this->cpu).registers[4] = 0;
  (this->cpu).registers[5] = 0;
  (this->cpu).registers[2] = 0;
  (this->cpu).registers[3] = 0;
  (this->cpu).registers[0] = 0;
  (this->cpu).registers[1] = 0;
  size._M_state = (__mbstate_t)fileName;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_28);
  _Var2 = std::operator|(_S_in,_S_bin);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::ifstream::ifstream(local_230,(string *)fileName,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
  }
  else {
    auVar6 = std::istream::tellg();
    size._M_off = auVar6._8_8_;
    auStack_28 = auVar6._0_8_;
    uVar3 = std::fpos::operator_cast_to_long((fpos *)auStack_28);
    if ((long)uVar3 < 0) {
      uVar3 = uVar3 + 0xfff;
    }
    (this->cpu).codeSize = (uVar3 & 0xfffffffffffff000) + 0x1000;
    (this->cpu).stackSize = 0x1000;
    puVar4 = (uchar *)malloc((this->cpu).stackSize + 10 + (this->cpu).codeSize);
    (this->cpu).codeBase = puVar4;
    std::istream::seekg((long)local_230,_S_beg);
    puVar4 = (this->cpu).codeBase;
    std::fpos::operator_cast_to_long((fpos *)auStack_28);
    std::istream::read(local_230,(long)puVar4);
    std::ifstream::close();
    uVar5 = std::fpos::operator_cast_to_long((fpos *)auStack_28);
    (this->cpu).bytecodeSize = uVar5;
    (this->cpu).stackBase = (this->cpu).codeBase + (this->cpu).codeSize;
    memset((this->cpu).stackBase,0,0x12);
    (this->cpu).registers[7] = (this->cpu).codeSize;
    (this->cpu).registers[6] = (this->cpu).codeSize;
    (this->cpu).registers[8] = 0;
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

NanoVM::NanoVM(std::string fileName) {
	memset(&cpu, 0x00, sizeof(cpu));
	// Zero out registers
	memset(cpu.registers, 0x00, sizeof(cpu.registers));

	std::streampos size;

	std::ifstream file(fileName, std::ios::in | std::ios::binary | std::ios::ate);
	if (file.is_open())
	{
		size = file.tellg();

		cpu.codeSize = (NANOVM_PAGE_SIZE * (1 + (size / NANOVM_PAGE_SIZE)));
		cpu.stackSize = NANOVM_PAGE_SIZE;

		// allocate whole memory, code pages, stack, +10 bytes
		// +10 bytes is for instruction fetching which might read more bytes than the instruction size
		// This avoids reading memory out side of the VM
		cpu.codeBase = (unsigned char*)malloc(cpu.stackSize + 10 + cpu.codeSize);

		file.seekg(0, std::ios::beg);
		file.read((char*)cpu.codeBase, size);
		file.close();

		cpu.bytecodeSize = size;
		// Set stack base. Stack grows up instead of down like in x86
		cpu.stackBase = cpu.codeBase + cpu.codeSize;
		// Zero out stack + the last 10 bytes
		memset(cpu.stackBase, 0x00, sizeof(cpu.stackSize) + 10);
		cpu.registers[esp] = cpu.codeSize;
		cpu.registers[bp] = cpu.codeSize;
		// Set IP to the beginning of code
		cpu.registers[ip] = 0;
	}
	else std::cout << "Unable to open file";
}